

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

maybe<color,_void> * __thiscall
pstore::command_line::parser<color,_void>::operator()
          (maybe<color,_void> *__return_storage_ptr__,parser<color,_void> *this,string *v)

{
  type tVar1;
  bool bVar2;
  long lVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  maybe<color,_void> *pmVar4;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  undefined7 extraout_var_05;
  _Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::_lambda(pstore::command_line::literal_const&)_1_>
  *in_RCX;
  long lVar5;
  __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  _Var6;
  literal *plVar7;
  
  lVar3 = (long)v - (long)this;
  lVar5 = (lVar3 >> 3) * -0x71c71c71c71c71c7 >> 2;
  if (0 < lVar5) {
    plVar7 = (literal *)(this + lVar5 * 9);
    lVar5 = lVar5 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
              ::operator()(in_RCX,(__normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
                                   )this);
      pmVar4 = (maybe<color,_void> *)CONCAT71(extraout_var,bVar2);
      _Var6._M_current = (literal *)this;
      if (bVar2) goto LAB_0011b4c4;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
              ::operator()(in_RCX,(literal *)((long)this + 0x48));
      pmVar4 = (maybe<color,_void> *)CONCAT71(extraout_var_00,bVar2);
      _Var6._M_current = (literal *)((long)this + 0x48);
      if (bVar2) goto LAB_0011b4c4;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
              ::operator()(in_RCX,(literal *)((long)this + 0x90));
      pmVar4 = (maybe<color,_void> *)CONCAT71(extraout_var_01,bVar2);
      _Var6._M_current = (literal *)((long)this + 0x90);
      if (bVar2) goto LAB_0011b4c4;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
              ::operator()(in_RCX,(literal *)((long)this + 0xd8));
      pmVar4 = (maybe<color,_void> *)CONCAT71(extraout_var_02,bVar2);
      _Var6._M_current = (literal *)((long)this + 0xd8);
      if (bVar2) goto LAB_0011b4c4;
      this = (parser<color,_void> *)((long)this + 0x120);
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
    lVar3 = (long)v - (long)plVar7;
    this = (parser<color,_void> *)plVar7;
  }
  pmVar4 = (maybe<color,_void> *)((lVar3 >> 3) * -0x71c71c71c71c71c7);
  if (pmVar4 == (maybe<color,_void> *)0x1) {
LAB_0011b4ad:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
            ::operator()(in_RCX,(__normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
                                 )this);
    pmVar4 = (maybe<color,_void> *)CONCAT71(extraout_var_05,bVar2);
    _Var6._M_current = (literal *)this;
    if (!bVar2) {
      _Var6._M_current = (literal *)v;
    }
  }
  else if (pmVar4 == (maybe<color,_void> *)0x2) {
LAB_0011b495:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
            ::operator()(in_RCX,(__normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
                                 )this);
    pmVar4 = (maybe<color,_void> *)CONCAT71(extraout_var_04,bVar2);
    _Var6._M_current = (literal *)this;
    if (!bVar2) {
      this = (parser<color,_void> *)((long)this + 0x48);
      goto LAB_0011b4ad;
    }
  }
  else {
    if (pmVar4 != (maybe<color,_void> *)0x3) goto LAB_0011b4d4;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<pstore::command_line::parser<ClParser_Enum_Test::TestBody()::color,void>::operator()(std::__cxx11::string_const&)const::{lambda(pstore::command_line::literal_const&)#1}>
            ::operator()(in_RCX,(__normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
                                 )this);
    pmVar4 = (maybe<color,_void> *)CONCAT71(extraout_var_03,bVar2);
    _Var6._M_current = (literal *)this;
    if (!bVar2) {
      this = (parser<color,_void> *)((long)this + 0x48);
      goto LAB_0011b495;
    }
  }
LAB_0011b4c4:
  if (_Var6._M_current != (literal *)v) {
    tVar1 = (type)(_Var6._M_current)->value;
    __return_storage_ptr__->valid_ = true;
    __return_storage_ptr__->storage_ = tVar1;
    return (maybe<color,_void> *)(ulong)(uint)tVar1;
  }
LAB_0011b4d4:
  __return_storage_ptr__->valid_ = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x1 = 0;
  __return_storage_ptr__->storage_ = (type)0x0;
  return pmVar4;
}

Assistant:

maybe<T> operator() (std::string const & v) const {
                auto begin = this->begin ();
                auto end = this->end ();
                auto it =
                    std::find_if (begin, end, [&v] (literal const & lit) { return v == lit.name; });
                if (it == end) {
                    return nothing<T> ();
                }
                return just (T (it->value));
            }